

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.h
# Opt level: O3

void flatbuffers::ResizeVector<flatbuffers::Offset<flatbuffers::String>>
               (Schema *schema,uoffset_t newsize,Offset<flatbuffers::String> val,
               Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *vec,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *flatbuf,Object *root_table)

{
  undefined1 auVar1 [16];
  uint8_t *puVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  int iVar7;
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  
  uVar5 = newsize - *(uoffset_t *)vec;
  puVar2 = ResizeAnyVector(schema,newsize,(VectorOfAny *)vec,*(uoffset_t *)vec,4,flatbuf,root_table)
  ;
  auVar1 = _DAT_001c6e90;
  if (0 < (int)uVar5) {
    lVar3 = (ulong)uVar5 - 1;
    auVar6._8_4_ = (int)lVar3;
    auVar6._0_8_ = lVar3;
    auVar6._12_4_ = (int)((ulong)lVar3 >> 0x20);
    uVar4 = 0;
    auVar6 = auVar6 ^ _DAT_001c6e90;
    auVar8 = _DAT_001c6e70;
    auVar9 = _DAT_001c6e80;
    do {
      auVar10 = auVar9 ^ auVar1;
      iVar7 = auVar6._4_4_;
      if ((bool)(~(auVar10._4_4_ == iVar7 && auVar6._0_4_ < auVar10._0_4_ || iVar7 < auVar10._4_4_)
                & 1)) {
        *(offset_type *)(puVar2 + uVar4 * 4) = val.o;
      }
      if ((auVar10._12_4_ != auVar6._12_4_ || auVar10._8_4_ <= auVar6._8_4_) &&
          auVar10._12_4_ <= auVar6._12_4_) {
        *(offset_type *)(puVar2 + uVar4 * 4 + 4) = val.o;
      }
      auVar10 = auVar8 ^ auVar1;
      iVar11 = auVar10._4_4_;
      if (iVar11 <= iVar7 && (iVar11 != iVar7 || auVar10._0_4_ <= auVar6._0_4_)) {
        *(offset_type *)(puVar2 + uVar4 * 4 + 8) = val.o;
        *(offset_type *)(puVar2 + uVar4 * 4 + 0xc) = val.o;
      }
      uVar4 = uVar4 + 4;
      lVar3 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 4;
      auVar9._8_8_ = lVar3 + 4;
      lVar3 = auVar8._8_8_;
      auVar8._0_8_ = auVar8._0_8_ + 4;
      auVar8._8_8_ = lVar3 + 4;
    } while ((uVar5 + 3 & 0xfffffffc) != uVar4);
  }
  return;
}

Assistant:

void ResizeVector(const reflection::Schema &schema, uoffset_t newsize, T val,
                  const Vector<T> *vec, std::vector<uint8_t> *flatbuf,
                  const reflection::Object *root_table = nullptr) {
  auto delta_elem = static_cast<int>(newsize) - static_cast<int>(vec->size());
  auto newelems = ResizeAnyVector(
      schema, newsize, reinterpret_cast<const VectorOfAny *>(vec), vec->size(),
      static_cast<uoffset_t>(sizeof(T)), flatbuf, root_table);
  // Set new elements to "val".
  for (int i = 0; i < delta_elem; i++) {
    auto loc = newelems + i * sizeof(T);
    auto is_scalar = flatbuffers::is_scalar<T>::value;
    if (is_scalar) {
      WriteScalar(loc, val);
    } else {  // struct
      *reinterpret_cast<T *>(loc) = val;
    }
  }
}